

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O2

int OpenSSLWrapper::SslServerContext::ALPN_CB
              (SSL *param_1,uchar **out,uchar *outlen,uchar *in,uint inlen,void *arg)

{
  byte *pbVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  __type _Var6;
  int iVar7;
  byte *pbVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type sVar9;
  uint uVar10;
  string strProtokoll;
  
  uVar10 = 1;
  if (((out != (uchar **)0x0) && (in != (uchar *)0x0)) && (arg != (void *)0x0)) {
    pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((long)arg + 0x50);
    for (__rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)arg + 0x48); __rhs != pbVar3; __rhs = __rhs + 1) {
      uVar10 = 0;
      pbVar8 = in;
      while (uVar10 < inlen) {
        pbVar1 = pbVar8 + 1;
        bVar2 = *pbVar8;
        strProtokoll._M_dataplus._M_p = (pointer)&strProtokoll.field_2;
        pbVar8 = pbVar8 + (ulong)bVar2 + 1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&strProtokoll,pbVar1);
        sVar5 = strProtokoll._M_string_length;
        _Var4._M_p = strProtokoll._M_dataplus._M_p;
        for (sVar9 = 0; sVar5 != sVar9; sVar9 = sVar9 + 1) {
          iVar7 = tolower((int)_Var4._M_p[sVar9]);
          _Var4._M_p[sVar9] = (char)iVar7;
        }
        _Var6 = std::operator==(&strProtokoll,__rhs);
        if (_Var6) {
          *out = pbVar1;
          *outlen = bVar2;
          pbVar8 = pbVar1;
        }
        else {
          uVar10 = uVar10 + bVar2 + 1;
        }
        std::__cxx11::string::~string((string *)&strProtokoll);
        if (_Var6) goto LAB_0011e088;
      }
    }
LAB_0011e088:
    uVar10 = (uint)(__rhs == pbVar3);
  }
  return uVar10;
}

Assistant:

int SslServerContext::ALPN_CB(SSL* /*ssl*/, const unsigned char **out, unsigned char *outlen, const unsigned char *in, unsigned int inlen, void *arg)
    {
        SslServerContext* pSslCtx = static_cast<SslServerContext*>(arg);
        if (pSslCtx == nullptr || in == nullptr || out == nullptr)
            return 1;

        for (auto& strProt : pSslCtx->m_vstrAlpnProtoList)
        {
            const uint8_t* inTmp = in;
            for (unsigned int i = 0; i < inlen;)
            {
                uint8_t nLen = *inTmp++;
                string strProtokoll(reinterpret_cast<const char*>(inTmp), static_cast<size_t>(nLen));
                transform(begin(strProtokoll), end(strProtokoll), begin(strProtokoll), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

                if (strProtokoll == strProt)
                {
                    *out = inTmp, *outlen = nLen;
                    return 0;
                }
                inTmp += nLen;
                i += nLen + 1;
            }
        }

        return 1;
    }